

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

void __thiscall Lib::List<Saturation::ExtensionalityClause>::DelIterator::del(DelIterator *this)

{
  List<Saturation::ExtensionalityClause> *pLVar1;
  List<Saturation::ExtensionalityClause> *tl;
  undefined8 *in_RDI;
  size_t in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  
  if (in_RDI[2] == *(long *)*in_RDI) {
    pLVar1 = List<Saturation::ExtensionalityClause>::tail
                       (*(List<Saturation::ExtensionalityClause> **)*in_RDI);
    *(List<Saturation::ExtensionalityClause> **)*in_RDI = pLVar1;
    if (in_RDI[2] != 0) {
      List<Saturation::ExtensionalityClause>::operator_delete
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    }
    in_RDI[2] = 0;
  }
  else {
    pLVar1 = (List<Saturation::ExtensionalityClause> *)in_RDI[1];
    tl = List<Saturation::ExtensionalityClause>::tail
                   ((List<Saturation::ExtensionalityClause> *)in_RDI[2]);
    List<Saturation::ExtensionalityClause>::setTail(pLVar1,tl);
    if ((void *)in_RDI[2] != (void *)0x0) {
      List<Saturation::ExtensionalityClause>::operator_delete((void *)in_RDI[2],(size_t)pLVar1);
    }
    in_RDI[2] = in_RDI[1];
  }
  return;
}

Assistant:

void del()
    {
      // we can only delete the element returned by next
      ASS_NEQ(_cur,0);
      // check that two delete requests in row did not occur
      ASS_NEQ(_cur,_prev);

      if (_cur == _lst) { // the first element must be deleted
	_lst = _lst->tail();
	delete _cur;
	_cur = 0;
	return;
      }

      ASS_NEQ(_prev,0);
      // not the first element
      _prev->setTail(_cur->tail());
      delete _cur;
      _cur = _prev;
    }